

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material_palette.c
# Opt level: O2

bool_t prf_material_palette_load_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  pool_t pool_id;
  uint16_t uVar1;
  uint8_t *puVar2;
  uint uVar3;
  bool_t bVar4;
  long lVar5;
  float32_t *pfVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  float32_t fVar10;
  
  uVar1 = bf_get_uint16_be(bfile);
  node->opcode = uVar1;
  if (uVar1 == prf_material_palette_info.opcode) {
    uVar1 = bf_get_uint16_be(bfile);
    node->length = uVar1;
    if ((4 < uVar1) && (node->data == (uint8_t *)0x0)) {
      pool_id = state->model->mempool_id;
      if (pool_id == 0) {
        puVar2 = (uint8_t *)malloc((ulong)(uVar1 - 4));
      }
      else {
        puVar2 = (uint8_t *)pool_malloc(pool_id,uVar1 - 4);
      }
      node->data = puVar2;
      if (puVar2 == (uint8_t *)0x0) {
        prf_error(9,"memory allocation problem (returned NULL)");
        uVar3 = 4;
        goto LAB_00107ee9;
      }
    }
    iVar9 = 4;
    while( true ) {
      uVar3 = (uint)node->length;
      iVar8 = iVar9;
      if ((int)(uint)node->length < iVar9 + 4) break;
      pfVar6 = (float32_t *)(node->data + iVar9);
      fVar10 = bf_get_float32_be(bfile);
      pfVar6[-1] = fVar10;
      uVar3 = (uint)node->length;
      iVar8 = iVar9 + 4;
      if ((int)(uint)node->length < iVar9 + 8) break;
      fVar10 = bf_get_float32_be(bfile);
      *pfVar6 = fVar10;
      uVar3 = (uint)node->length;
      iVar8 = iVar9 + 8;
      if ((int)(uint)node->length < iVar9 + 0xc) break;
      fVar10 = bf_get_float32_be(bfile);
      pfVar6[1] = fVar10;
      uVar3 = (uint)node->length;
      iVar8 = iVar9 + 0xc;
      if ((int)(uint)node->length < iVar9 + 0x10) break;
      fVar10 = bf_get_float32_be(bfile);
      pfVar6[2] = fVar10;
      uVar3 = (uint)node->length;
      iVar8 = iVar9 + 0x10;
      if ((int)(uint)node->length < iVar9 + 0x14) break;
      fVar10 = bf_get_float32_be(bfile);
      pfVar6[3] = fVar10;
      uVar3 = (uint)node->length;
      iVar8 = iVar9 + 0x14;
      if ((int)(uint)node->length < iVar9 + 0x18) break;
      fVar10 = bf_get_float32_be(bfile);
      pfVar6[4] = fVar10;
      uVar3 = (uint)node->length;
      iVar8 = iVar9 + 0x18;
      if ((int)(uint)node->length < iVar9 + 0x1c) break;
      fVar10 = bf_get_float32_be(bfile);
      pfVar6[5] = fVar10;
      uVar3 = (uint)node->length;
      iVar8 = iVar9 + 0x1c;
      if ((int)(uint)node->length < iVar9 + 0x20) break;
      fVar10 = bf_get_float32_be(bfile);
      pfVar6[6] = fVar10;
      uVar3 = (uint)node->length;
      iVar8 = iVar9 + 0x20;
      if ((int)(uint)node->length < iVar9 + 0x24) break;
      fVar10 = bf_get_float32_be(bfile);
      pfVar6[7] = fVar10;
      uVar3 = (uint)node->length;
      iVar8 = iVar9 + 0x24;
      if ((int)(uint)node->length < iVar9 + 0x28) break;
      fVar10 = bf_get_float32_be(bfile);
      pfVar6[8] = fVar10;
      uVar3 = (uint)node->length;
      iVar8 = iVar9 + 0x28;
      if ((int)(uint)node->length < iVar9 + 0x2c) break;
      fVar10 = bf_get_float32_be(bfile);
      pfVar6[9] = fVar10;
      uVar3 = (uint)node->length;
      iVar8 = iVar9 + 0x2c;
      if ((int)(uint)node->length < iVar9 + 0x30) break;
      fVar10 = bf_get_float32_be(bfile);
      pfVar6[10] = fVar10;
      uVar3 = (uint)node->length;
      iVar8 = iVar9 + 0x30;
      if ((int)(uint)node->length < iVar9 + 0x34) break;
      fVar10 = bf_get_float32_be(bfile);
      pfVar6[0xb] = fVar10;
      uVar3 = (uint)node->length;
      iVar8 = iVar9 + 0x34;
      if ((int)(uint)node->length < iVar9 + 0x38) break;
      fVar10 = bf_get_float32_be(bfile);
      pfVar6[0xc] = fVar10;
      uVar3 = (uint)node->length;
      iVar8 = iVar9 + 0x38;
      if ((int)(uint)node->length < iVar9 + 0x3c) break;
      fVar10 = (float32_t)bf_get_uint32_be(bfile);
      pfVar6[0xd] = fVar10;
      uVar3 = (uint)node->length;
      iVar8 = iVar9 + 0x3c;
      if ((int)(uint)node->length < iVar9 + 0x48) break;
      bf_read(bfile,(uint8_t *)(pfVar6 + 0xe),0xc);
      iVar7 = iVar9 + 0xb8;
      lVar5 = 0;
      iVar8 = iVar9 + 0x48;
      while ((iVar9 = iVar7, lVar5 != 0x1c && (iVar9 = iVar8, iVar8 + 4 <= (int)(uint)node->length))
            ) {
        fVar10 = (float32_t)bf_get_uint32_be(bfile);
        pfVar6[lVar5 + 0x11] = fVar10;
        lVar5 = lVar5 + 1;
        iVar8 = iVar8 + 4;
      }
    }
    bVar4 = 1;
    if (uVar3 - iVar8 != 0 && iVar8 <= (int)uVar3) {
      bf_read(bfile,node->data + (long)iVar8 + -4,uVar3 - iVar8);
    }
  }
  else {
    prf_error(9,"tried material palette load method for node of type %d.",(ulong)uVar1);
    uVar3 = 2;
LAB_00107ee9:
    bVar4 = 0;
    bf_rewind(bfile,uVar3);
  }
  return bVar4;
}

Assistant:

static
bool_t
prf_material_palette_load_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int pos, count;

    assert( node != NULL && state != NULL && bfile != NULL );

    node->opcode = bf_get_uint16_be( bfile );
    if ( node->opcode != prf_material_palette_info.opcode ) {
        prf_error( 9, "tried material palette load method for node of type %d.",
            node->opcode );
        bf_rewind( bfile, 2 );
        return FALSE;
    }

    node->length = bf_get_uint16_be( bfile );

    if ( node->length > 4 && node->data == NULL ) { /* node preallocated */
        assert( state->model != NULL );
        if ( state->model->mempool_id == 0 )
            node->data = (uint8_t *)malloc( node->length - 4 + NODE_DATA_PAD );
        else
            node->data = (uint8_t *)pool_malloc( state->model->mempool_id,
                node->length - 4 + NODE_DATA_PAD );
        if ( node->data == NULL ) {
            prf_error( 9, "memory allocation problem (returned NULL)" );
            bf_rewind( bfile, 4 );
            return FALSE;
        }
    }

    pos = 4;
    count = 0;
    do {
        int i;
        node_data * data;
        data = (node_data *) (node->data + pos - 4);

        if ( node->length < (pos + 4) ) break;
        data->ambient_red = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->ambient_green = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->ambient_blue = bf_get_float32_be( bfile ); pos += 4;

        if ( node->length < (pos + 4) ) break;
        data->diffuse_red = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->diffuse_green = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->diffuse_blue = bf_get_float32_be( bfile ); pos += 4;

        if ( node->length < (pos + 4) ) break;
        data->specular_red = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->specular_green = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->specular_blue = bf_get_float32_be( bfile ); pos += 4;

        if ( node->length < (pos + 4) ) break;
        data->emissive_red = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->emissive_green = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->emissive_blue = bf_get_float32_be( bfile ); pos += 4;

        if ( node->length < (pos + 4) ) break;
        data->shininess = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->alpha = bf_get_float32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->flags = bf_get_uint32_be( bfile ); pos += 4;

        if ( node->length < (pos + 12) ) break;
        bf_read( bfile, (uint8_t *) data->name, 12 ); pos += 12;
        for ( i = 0; i < 28 && node->length >= (pos + 4); i++ ) {
            data->reserved1[i] = bf_get_uint32_be( bfile ); pos += 4;
        }
        count++;
    } while ( TRUE );

    if ( node->length > pos )
        pos += bf_read( bfile, node->data + pos - 4, node->length - pos );

    return TRUE;
}